

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O2

fdb_txn * wal_earliest_txn(filemgr *file,fdb_txn *cur_txn)

{
  list_elem *plVar1;
  fdb_txn *pfVar2;
  ulong uVar3;
  list *plVar4;
  ulong uVar5;
  ulong uVar6;
  fdb_txn *pfVar7;
  fdb_txn *pfVar8;
  
  pthread_spin_lock(&file->wal->lock);
  plVar4 = &file->wal->txn_list;
  uVar5 = 0;
  pfVar7 = (fdb_txn *)0x0;
  while (plVar1 = plVar4->head, plVar1 != (list_elem *)0x0) {
    pfVar2 = (fdb_txn *)plVar1[1].prev;
    uVar6 = uVar5;
    pfVar8 = pfVar7;
    if ((((pfVar2 != cur_txn) && (pfVar2->items->head != (list_elem *)0x0)) &&
        (uVar3 = pfVar2->prev_revnum, uVar6 = uVar3, pfVar8 = pfVar2, uVar5 != 0)) &&
       (uVar6 = uVar5, pfVar8 = pfVar7, uVar3 < uVar5)) {
      uVar6 = uVar3;
      pfVar8 = pfVar2;
    }
    uVar5 = uVar6;
    pfVar7 = pfVar8;
    plVar4 = (list *)&plVar1->next;
  }
  pthread_spin_unlock(&file->wal->lock);
  return pfVar7;
}

Assistant:

fdb_txn * wal_earliest_txn(struct filemgr *file, fdb_txn *cur_txn)
{
    struct list_elem *le;
    struct wal_txn_wrapper *txn_wrapper;
    fdb_txn *txn;
    fdb_txn *ret = NULL;
    uint64_t min_revnum = 0;

    spin_lock(&file->wal->lock);

    le = list_begin(&file->wal->txn_list);
    while(le) {
        txn_wrapper = _get_entry(le, struct wal_txn_wrapper, le);
        txn = txn_wrapper->txn;

        if (txn != cur_txn && list_begin(txn->items)) {
            if (min_revnum == 0 || txn->prev_revnum < min_revnum) {
                min_revnum = txn->prev_revnum;
                ret = txn;
            }
        }
        le = list_next(le);
    }
    spin_unlock(&file->wal->lock);

    return ret;
}